

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O1

target_ulong
helper_cc_compute_all_x86_64(target_ulong dst,target_ulong src1,target_ulong src2,int op)

{
  byte bVar1;
  int iVar2;
  uint8_t src1_00;
  uint src1_02;
  ulong uVar3;
  uint8_t dst_00;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  uint16_t src1_01;
  uint16_t dst_01;
  
  src1_02 = (uint)src1;
  dst_00 = (uint8_t)dst;
  uVar4 = (uint)dst;
  dst_01 = (uint16_t)dst;
  src1_00 = (uint8_t)src1;
  src1_01 = (uint16_t)src1;
  bVar1 = (byte)(dst >> 0x38);
  switch(op) {
  case 1:
    goto switchD_0050ab5e_caseD_1;
  case 2:
    return (ulong)(src1 != 0) |
           (ulong)((uint)(src1 != 0) << 0xb | uVar4 & 0x80 | (uint)((dst & 0xff) == 0) << 6) |
           (ulong)"\x04"[dst & 0xff];
  case 3:
    uVar4 = compute_all_mulw(dst_01,src1);
    break;
  case 4:
    bVar1 = "\x04"[dst & 0xff];
    uVar3 = (ulong)((uint)(src1 != 0) << 0xb | uVar4 >> 0x18 & 0xffffff80 | (uint)(uVar4 == 0) << 6)
            | (ulong)(src1 != 0);
    goto LAB_0050af25;
  case 5:
    return (ulong)(src1 != 0) |
           (ulong)((uint)(src1 != 0) << 0xb | bVar1 & 0xffffff80 | (uint)(dst == 0) << 6) |
           (ulong)"\x04"[dst & 0xff];
  case 6:
    uVar4 = compute_all_addb(dst_00,src1_00);
    break;
  case 7:
    uVar4 = compute_all_addw(dst_01,src1_01);
    break;
  case 8:
    uVar4 = compute_all_addl(uVar4,src1_02);
    break;
  case 9:
    uVar4 = compute_all_addq(dst,src1);
    break;
  case 10:
    uVar4 = compute_all_adcb(dst_00,src1_00,(uint8_t)src2);
    break;
  case 0xb:
    uVar4 = compute_all_adcw(dst_01,src1_01,(uint16_t)src2);
    break;
  case 0xc:
    uVar4 = compute_all_adcl(uVar4,src1_02,(uint32_t)src2);
    break;
  case 0xd:
    uVar4 = compute_all_adcq(dst,src1,src2);
    break;
  case 0xe:
    uVar4 = compute_all_subb(dst_00,src1_00);
    break;
  case 0xf:
    uVar4 = compute_all_subw(dst_01,src1_01);
    break;
  case 0x10:
    uVar4 = compute_all_subl(uVar4,src1_02);
    break;
  case 0x11:
    uVar4 = compute_all_subq(dst,src1);
    break;
  case 0x12:
    uVar4 = compute_all_sbbb(dst_00,src1_00,(uint8_t)src2);
    break;
  case 0x13:
    uVar4 = compute_all_sbbw(dst_01,src1_01,(uint16_t)src2);
    break;
  case 0x14:
    uVar4 = compute_all_sbbl(uVar4,src1_02,(uint32_t)src2);
    break;
  case 0x15:
    uVar4 = compute_all_sbbq(dst,src1,src2);
    break;
  case 0x16:
    return (ulong)(uVar4 & 0x80 | (uint)((dst & 0xff) == 0) << 6) | (ulong)"\x04"[dst & 0xff];
  case 0x17:
    bVar5 = "\x04"[dst & 0xff];
    goto LAB_0050af3c;
  case 0x18:
    bVar5 = "\x04"[dst & 0xff];
    goto LAB_0050af61;
  case 0x19:
    bVar5 = "\x04"[dst & 0xff];
    goto LAB_0050ad61;
  case 0x1a:
    uVar4 = compute_all_incb(dst_00,src1_00);
    break;
  case 0x1b:
    uVar4 = compute_all_incw(dst_01,src1_01);
    break;
  case 0x1c:
    iVar2 = compute_all_incl(uVar4,src1_02);
    goto LAB_0050af80;
  case 0x1d:
    iVar2 = compute_all_incq(dst,src1);
    goto LAB_0050af80;
  case 0x1e:
    uVar4 = compute_all_decb(dst_00,src1_00);
    break;
  case 0x1f:
    uVar4 = compute_all_decw(dst_01,src1_01);
    break;
  case 0x20:
    iVar2 = compute_all_decl(uVar4,src1_02);
    goto LAB_0050af80;
  case 0x21:
    iVar2 = compute_all_decq(dst,src1);
LAB_0050af80:
    return (long)iVar2;
  case 0x22:
    uVar4 = compute_all_shlb(dst_00,src1_00);
    break;
  case 0x23:
    uVar4 = compute_all_shlw(dst_01,src1_01);
    break;
  case 0x24:
    return (ulong)((src1_02 ^ uVar4) >> 0x14 & 0x800 |
                   uVar4 >> 0x18 & 0xffffff80 | (uint)(uVar4 == 0) << 6 | (uint)(src1 >> 0x1f) & 1 |
                  (uint)"\x04"[dst & 0xff]);
  case 0x25:
    uVar3 = src1 >> 0x3f;
    goto LAB_0050ace1;
  case 0x26:
    uVar4 = compute_all_sarb(dst_00,src1_00);
    break;
  case 0x27:
    uVar4 = compute_all_sarw(dst_01,src1_01);
    break;
  case 0x28:
    bVar1 = "\x04"[dst & 0xff];
    uVar3 = (ulong)((src1_02 ^ uVar4) >> 0x14 & 0x800 |
                   uVar4 >> 0x18 & 0xffffff80 | src1_02 & 1 | (uint)(uVar4 == 0) << 6);
LAB_0050af25:
    return uVar3 | bVar1;
  case 0x29:
    uVar3 = (ulong)(src1_02 & 1);
LAB_0050ace1:
    return (ulong)(((uint)(src1 >> 0x20) ^ (uint)(dst >> 0x20)) >> 0x14 & 0x800) |
           (ulong)(bVar1 & 0xffffff80) | (ulong)(dst == 0) << 6 | uVar3 | (ulong)"\x04"[dst & 0xff];
  case 0x2a:
    bVar5 = src1_00 == '\0';
    bVar6 = dst_00 == '\0';
    uVar4 = uVar4 & 0x80;
    goto LAB_0050ae09;
  case 0x2b:
    bVar5 = src1_01 == 0;
LAB_0050af3c:
    bVar6 = dst_01 == 0;
    uVar4 = uVar4 >> 8 & 0x80;
LAB_0050af71:
    uVar4 = uVar4 | (uint)bVar6 << 6;
LAB_0050af73:
    return (ulong)uVar4 | (ulong)bVar5;
  case 0x2c:
    bVar5 = src1_02 == 0;
LAB_0050af61:
    bVar6 = uVar4 == 0;
    uVar4 = uVar4 >> 0x18 & 0xffffff80;
    goto LAB_0050af71;
  case 0x2d:
    bVar5 = src1 == 0;
LAB_0050ad61:
    bVar6 = dst == 0;
    uVar4 = bVar1 & 0xffffff80;
LAB_0050ae09:
    uVar4 = uVar4 | (uint)bVar6 << 6;
    goto LAB_0050af73;
  case 0x2e:
    return src1 & 0xfffffffffffffffe | dst;
  case 0x2f:
    return src1 & 0xfffffffffffff7ff | src2 << 0xb;
  case 0x30:
    return src2 << 0xb | src1 & 0xfffffffffffff7fe | dst;
  case 0x31:
    return 0x44;
  case 0x32:
    return (ulong)(src1 == 0) << 6;
  default:
    src1 = 0;
    goto switchD_0050ab5e_caseD_1;
  }
  src1 = (target_ulong)uVar4;
switchD_0050ab5e_caseD_1:
  return src1;
}

Assistant:

target_ulong helper_cc_compute_all(target_ulong dst, target_ulong src1,
                                   target_ulong src2, int op)
{
    switch (op) {
    default: /* should never happen */
        return 0;

    case CC_OP_EFLAGS:
        return src1;
    case CC_OP_CLR:
        return CC_Z | CC_P;
    case CC_OP_POPCNT:
        return src1 ? 0 : CC_Z;

    case CC_OP_MULB:
        return compute_all_mulb(dst, src1);
    case CC_OP_MULW:
        return compute_all_mulw(dst, src1);
    case CC_OP_MULL:
        return compute_all_mull(dst, src1);

    case CC_OP_ADDB:
        return compute_all_addb(dst, src1);
    case CC_OP_ADDW:
        return compute_all_addw(dst, src1);
    case CC_OP_ADDL:
        return compute_all_addl(dst, src1);

    case CC_OP_ADCB:
        return compute_all_adcb(dst, src1, src2);
    case CC_OP_ADCW:
        return compute_all_adcw(dst, src1, src2);
    case CC_OP_ADCL:
        return compute_all_adcl(dst, src1, src2);

    case CC_OP_SUBB:
        return compute_all_subb(dst, src1);
    case CC_OP_SUBW:
        return compute_all_subw(dst, src1);
    case CC_OP_SUBL:
        return compute_all_subl(dst, src1);

    case CC_OP_SBBB:
        return compute_all_sbbb(dst, src1, src2);
    case CC_OP_SBBW:
        return compute_all_sbbw(dst, src1, src2);
    case CC_OP_SBBL:
        return compute_all_sbbl(dst, src1, src2);

    case CC_OP_LOGICB:
        return compute_all_logicb(dst, src1);
    case CC_OP_LOGICW:
        return compute_all_logicw(dst, src1);
    case CC_OP_LOGICL:
        return compute_all_logicl(dst, src1);

    case CC_OP_INCB:
        return compute_all_incb(dst, src1);
    case CC_OP_INCW:
        return compute_all_incw(dst, src1);
    case CC_OP_INCL:
        return compute_all_incl(dst, src1);

    case CC_OP_DECB:
        return compute_all_decb(dst, src1);
    case CC_OP_DECW:
        return compute_all_decw(dst, src1);
    case CC_OP_DECL:
        return compute_all_decl(dst, src1);

    case CC_OP_SHLB:
        return compute_all_shlb(dst, src1);
    case CC_OP_SHLW:
        return compute_all_shlw(dst, src1);
    case CC_OP_SHLL:
        return compute_all_shll(dst, src1);

    case CC_OP_SARB:
        return compute_all_sarb(dst, src1);
    case CC_OP_SARW:
        return compute_all_sarw(dst, src1);
    case CC_OP_SARL:
        return compute_all_sarl(dst, src1);

    case CC_OP_BMILGB:
        return compute_all_bmilgb(dst, src1);
    case CC_OP_BMILGW:
        return compute_all_bmilgw(dst, src1);
    case CC_OP_BMILGL:
        return compute_all_bmilgl(dst, src1);

    case CC_OP_ADCX:
        return compute_all_adcx(dst, src1, src2);
    case CC_OP_ADOX:
        return compute_all_adox(dst, src1, src2);
    case CC_OP_ADCOX:
        return compute_all_adcox(dst, src1, src2);

#ifdef TARGET_X86_64
    case CC_OP_MULQ:
        return compute_all_mulq(dst, src1);
    case CC_OP_ADDQ:
        return compute_all_addq(dst, src1);
    case CC_OP_ADCQ:
        return compute_all_adcq(dst, src1, src2);
    case CC_OP_SUBQ:
        return compute_all_subq(dst, src1);
    case CC_OP_SBBQ:
        return compute_all_sbbq(dst, src1, src2);
    case CC_OP_LOGICQ:
        return compute_all_logicq(dst, src1);
    case CC_OP_INCQ:
        return compute_all_incq(dst, src1);
    case CC_OP_DECQ:
        return compute_all_decq(dst, src1);
    case CC_OP_SHLQ:
        return compute_all_shlq(dst, src1);
    case CC_OP_SARQ:
        return compute_all_sarq(dst, src1);
    case CC_OP_BMILGQ:
        return compute_all_bmilgq(dst, src1);
#endif
    }
}